

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeNF
          (ChElementHexaANCF_3813 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ChMatrixNM<double,_8,_3> *pCVar1;
  Scalar *scalar;
  int i;
  long index;
  double x;
  Scalar SVar2;
  double y;
  ShapeVector Nz;
  ShapeVector Ny;
  ShapeVector N;
  ShapeVector Nx;
  ChMatrixNM<double,_3,_3> rd0;
  long local_2c8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
  local_298 [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_260;
  ShapeVector local_200;
  ShapeVector local_1c0;
  ShapeVector local_180;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_138;
  ShapeVector local_100;
  Matrix<double,_3,_3,_1,_3,_3> local_c0 [2];
  
  x = U;
  ShapeFunctions(this,&local_180,U,V,W);
  y = V;
  ShapeFunctionsDerivativeX(this,&local_100,x,V,W);
  ShapeFunctionsDerivativeY(this,&local_1c0,U,y,W);
  ShapeFunctionsDerivativeZ(this,&local_200,U,V,W);
  pCVar1 = &this->m_d0;
  local_2c8 = 0;
  local_298[0].m_lhs.m_matrix = pCVar1;
  local_298[0].m_rhs.m_matrix = &local_100;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  &local_260,local_c0,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_260,local_298);
  local_298[0].m_rhs.m_matrix = &local_1c0;
  local_298[0].m_lhs.m_matrix = pCVar1;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  &local_260,local_c0,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_260,local_298);
  local_298[0].m_rhs.m_matrix = &local_200;
  local_298[0].m_lhs.m_matrix = pCVar1;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  &local_260,local_c0,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_260,local_298);
  SVar2 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run(local_c0);
  *detJ = SVar2;
  *detJ = SVar2 * (this->m_InertFlexVec).m_data[0] * (this->m_InertFlexVec).m_data[1] *
                  (this->m_InertFlexVec).m_data[2] * 0.125;
  for (index = 0; index != 8; index = index + 1) {
    scalar = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_180,index
                       );
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_298,F,0,3);
    Eigen::operator*(&local_260,scalar,(StorageBaseType *)local_298);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_138,Qi,local_2c8,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
              (&local_138.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &local_260);
    local_2c8 = local_2c8 + 3;
  }
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // this->ComputeNF(U, V, Qi, detJ, F, state_x, state_w);
    ShapeVector N;
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctions(N, U, V, W);  // evaluate shape functions (in compressed vector)
    ShapeFunctionsDerivativeX(Nx, U, V, W);
    ShapeFunctionsDerivativeY(Ny, U, V, W);
    ShapeFunctionsDerivativeZ(Nz, U, V, W);

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = m_d0.transpose() * Nx.transpose();
    rd0.col(1) = m_d0.transpose() * Ny.transpose();
    rd0.col(2) = m_d0.transpose() * Nz.transpose();
    detJ = rd0.determinant();
    detJ *= this->GetLengthX() * this->GetLengthY() * this->GetLengthZ() / 8.0;

    for (int i = 0; i < 8; i++) {
        Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
    }
}